

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O2

void __thiscall
TPZCompElH1<pzshape::TPZShapeQuad>::TPZCompElH1
          (TPZCompElH1<pzshape::TPZShapeQuad> *this,void **vtt,TPZCompMesh *mesh,TPZGeoEl *gel,
          H1Family h1fam)

{
  void *pvVar1;
  int64_t nelem;
  TPZConnect *pTVar2;
  int i;
  ulong uVar3;
  long local_38;
  
  TPZIntelGen<pzshape::TPZShapeQuad>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeQuad>,vtt + 1,mesh,gel);
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
             super_TPZInterpolationSpace.super_TPZCompEl = pvVar1;
  *(void **)((long)(this->fConnectIndexes).fExtAlloc + *(long *)((long)pvVar1 + -0x60) + -0x70) =
       vtt[9];
  local_38 = -1;
  TPZManVector<long,_9>::TPZManVector(&this->fConnectIndexes,9,&local_38);
  this->fh1fam = h1fam;
  for (uVar3 = 0; uVar3 != 9; uVar3 = uVar3 + 1) {
    nelem = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x370))(this,uVar3 & 0xffffffff);
    (this->fConnectIndexes).super_TPZVec<long>.fStore[uVar3] = nelem;
    pTVar2 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (&(mesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
    pTVar2->fNElConnected = pTVar2->fNElConnected + 1;
  }
  return;
}

Assistant:

TPZCompElH1<TSHAPE>::TPZCompElH1(TPZCompMesh &mesh, TPZGeoEl *gel, const H1Family h1fam) : TPZRegisterClassId(&TPZCompElH1::ClassId),
TPZIntelGen<TSHAPE>(mesh,gel), fh1fam(h1fam){

	for(int i=0;i<TSHAPE::NSides;i++) {
		fConnectIndexes[i] = this->CreateMidSideConnect(i);
		mesh.ConnectVec()[fConnectIndexes[i]].IncrementElConnected();
	}
}